

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_do_scrollbarv(nk_flags *state,nk_command_buffer *out,nk_rect scroll,int has_scrolling,
                      float offset,float target,float step,float button_pixel_inc,
                      nk_style_scrollbar *style,nk_input *in,nk_user_font *font)

{
  nk_rect bounds;
  nk_rect bounds_00;
  nk_bool nVar1;
  long in_RCX;
  long in_RSI;
  nk_flags *in_R9;
  float fVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  nk_rect button;
  float scroll_h;
  nk_flags ws;
  float scroll_ratio;
  float scroll_off;
  float scroll_offset;
  float scroll_step;
  nk_rect cursor;
  nk_rect empty_south;
  nk_rect empty_north;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff14;
  nk_rect *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float fVar4;
  undefined4 in_stack_ffffffffffffff28;
  float fVar5;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar6;
  float in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  float fVar7;
  nk_button_behavior in_stack_ffffffffffffff38;
  nk_symbol_type in_stack_ffffffffffffff3c;
  float fVar8;
  float fVar9;
  undefined4 in_stack_ffffffffffffff70;
  float fVar10;
  undefined4 in_stack_ffffffffffffffc0;
  float local_30;
  undefined8 local_14;
  float local_c;
  float fStack_8;
  float local_4;
  
  if ((in_RSI == 0) || (in_RCX == 0)) {
    local_4 = 0.0;
  }
  else {
    local_c = (float)in_XMM1_Qa;
    if (local_c < 1.0) {
      local_c = 1.0;
    }
    fStack_8 = (float)((ulong)in_XMM1_Qa >> 0x20);
    if (fStack_8 < 0.0) {
      fStack_8 = 0.0;
    }
    if (fStack_8 < in_XMM3_Da) {
      local_30 = in_XMM2_Da;
      local_14 = in_XMM0_Qa;
      if (*(int *)(in_RCX + 0xe4) != 0) {
        local_14._0_4_ = (float)in_XMM0_Qa;
        if (0.0 <= fStack_8 - (local_c + local_c)) {
          fVar8 = fStack_8 - (local_c + local_c);
        }
        else {
          fVar8 = 0.0;
        }
        fVar7 = in_XMM5_Da;
        if (in_XMM4_Da < in_XMM5_Da) {
          fVar7 = in_XMM4_Da;
        }
        local_14._4_4_ = (float)((ulong)in_XMM0_Qa >> 0x20);
        bounds.y = local_c;
        bounds.x = local_14._4_4_;
        bounds.w = local_c;
        bounds.h = fVar8;
        fVar6 = fStack_8;
        fVar2 = local_c;
        fVar5 = local_c;
        fVar4 = local_c;
        fVar9 = fVar8;
        fVar10 = fVar7;
        nVar1 = nk_do_button_symbol((nk_flags *)CONCAT44(local_c,fStack_8),
                                    (nk_command_buffer *)CONCAT44(fVar8,fVar7),bounds,
                                    in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                    (nk_style_button *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                    (nk_input *)
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                    (nk_user_font *)CONCAT44(fVar7,in_stack_ffffffffffffff70));
        if (nVar1 != 0) {
          local_30 = in_XMM2_Da - fVar10;
        }
        bounds_00.y = fVar5;
        bounds_00.x = (local_14._4_4_ + fStack_8) - fVar4;
        bounds_00.w = fVar4;
        bounds_00.h = fVar9;
        nVar1 = nk_do_button_symbol((nk_flags *)CONCAT44(fVar2,fVar6),
                                    (nk_command_buffer *)CONCAT44(fVar8,fVar7),bounds_00,
                                    in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                    (nk_style_button *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                    (nk_input *)
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                    (nk_user_font *)CONCAT44(fVar10,in_stack_ffffffffffffff70));
        if (nVar1 != 0) {
          local_30 = local_30 + fVar10;
        }
        local_14 = CONCAT44(local_14._4_4_ + fVar4,(float)local_14);
        fStack_8 = fVar9;
      }
      fVar8 = fStack_8;
      if (in_XMM4_Da < fStack_8) {
        fVar8 = in_XMM4_Da;
      }
      fVar7 = local_30;
      if (in_XMM3_Da - fStack_8 <= local_30) {
        fVar7 = in_XMM3_Da - fStack_8;
      }
      if (0.0 <= fVar7) {
        fVar7 = local_30;
        if (in_XMM3_Da - fStack_8 <= local_30) {
          local_30 = in_XMM3_Da - fStack_8;
          fVar7 = local_30;
        }
      }
      else {
        local_30 = in_stack_ffffffffffffff30;
        fVar7 = 0.0;
      }
      if (0.0 <= (fStack_8 / in_XMM3_Da) * fStack_8 +
                 -(*(float *)(in_RCX + 0xcc) + *(float *)(in_RCX + 0xcc) +
                  *(float *)(in_RCX + 0xe0) * 2.0)) {
        fVar6 = (fStack_8 / in_XMM3_Da) * fStack_8 +
                -(*(float *)(in_RCX + 0xcc) + *(float *)(in_RCX + 0xcc) +
                 *(float *)(in_RCX + 0xe0) * 2.0);
      }
      else {
        fVar6 = 0.0;
      }
      fVar2 = (fVar7 / in_XMM3_Da) * fStack_8 + local_14._4_4_ + *(float *)(in_RCX + 0xcc) +
              *(float *)(in_RCX + 0xe0);
      if (0.0 <= fVar2 - local_14._4_4_) {
        fVar5 = fVar2 - local_14._4_4_;
      }
      else {
        fVar5 = 0.0;
      }
      if (0.0 <= (local_14._4_4_ + fStack_8) - (fVar2 + fVar6)) {
        fVar4 = (local_14._4_4_ + fStack_8) - (fVar2 + fVar6);
      }
      else {
        fVar4 = 0.0;
      }
      uVar3 = 0;
      local_4 = nk_scrollbar_behavior
                          (in_R9,(nk_input *)CONCAT44(fVar5,local_c),(int)local_14._4_4_,
                           (nk_rect *)CONCAT44(fVar4,local_c),
                           (nk_rect *)CONCAT44(fVar2 + fVar6,(float)local_14),
                           (nk_rect *)
                           CONCAT44(fVar6,local_c - (*(float *)(in_RCX + 0xcc) +
                                                     *(float *)(in_RCX + 0xcc) +
                                                    *(float *)(in_RCX + 0xdc) * 2.0)),
                           (nk_rect *)CONCAT44(in_XMM5_Da,in_stack_ffffffffffffffc0),fVar2,
                           (float)local_14 + *(float *)(in_RCX + 0xcc) + *(float *)(in_RCX + 0xdc),
                           fVar8,(nk_orientation)in_XMM4_Da);
      if (*(long *)(in_RCX + 600) != 0) {
        (**(code **)(in_RCX + 600))(in_RSI,*(undefined8 *)(in_RCX + 0x250));
      }
      nk_draw_scrollbar((nk_command_buffer *)CONCAT44(fVar7,local_30),(nk_flags)fVar6,
                        (nk_style_scrollbar *)CONCAT44(fVar4,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18,
                        (nk_rect *)CONCAT44(in_stack_ffffffffffffff14,uVar3));
      if (*(long *)(in_RCX + 0x260) != 0) {
        (**(code **)(in_RCX + 0x260))(in_RSI,*(undefined8 *)(in_RCX + 0x250));
      }
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

NK_LIB float
nk_do_scrollbarv(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect scroll, int has_scrolling,
float offset, float target, float step, float button_pixel_inc,
const struct nk_style_scrollbar *style, struct nk_input *in,
const struct nk_user_font *font)
{
struct nk_rect empty_north;
struct nk_rect empty_south;
struct nk_rect cursor;

float scroll_step;
float scroll_offset;
float scroll_off;
float scroll_ratio;

NK_ASSERT(out);
NK_ASSERT(style);
NK_ASSERT(state);
if (!out || !style) return 0;

scroll.w = NK_MAX(scroll.w, 1);
scroll.h = NK_MAX(scroll.h, 0);
if (target <= scroll.h) return 0;

/* optional scrollbar buttons */
if (style->show_buttons) {
nk_flags ws;
float scroll_h;
struct nk_rect button;

button.x = scroll.x;
button.w = scroll.w;
button.h = scroll.w;

scroll_h = NK_MAX(scroll.h - 2 * button.h,0);
scroll_step = NK_MIN(step, button_pixel_inc);

/* decrement button */
button.y = scroll.y;
if (nk_do_button_symbol(&ws, out, button, style->dec_symbol,
NK_BUTTON_REPEATER, &style->dec_button, in, font))
offset = offset - scroll_step;

/* increment button */
button.y = scroll.y + scroll.h - button.h;
if (nk_do_button_symbol(&ws, out, button, style->inc_symbol,
NK_BUTTON_REPEATER, &style->inc_button, in, font))
offset = offset + scroll_step;

scroll.y = scroll.y + button.h;
scroll.h = scroll_h;
}

/* calculate scrollbar constants */
scroll_step = NK_MIN(step, scroll.h);
scroll_offset = NK_CLAMP(0, offset, target - scroll.h);
scroll_ratio = scroll.h / target;
scroll_off = scroll_offset / target;

/* calculate scrollbar cursor bounds */
cursor.h = NK_MAX((scroll_ratio * scroll.h) - (2*style->border + 2*style->padding.y), 0);
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border + style->padding.y;
cursor.w = scroll.w - (2 * style->border + 2 * style->padding.x);
cursor.x = scroll.x + style->border + style->padding.x;

/* calculate empty space around cursor */
empty_north.x = scroll.x;
empty_north.y = scroll.y;
empty_north.w = scroll.w;
empty_north.h = NK_MAX(cursor.y - scroll.y, 0);

empty_south.x = scroll.x;
empty_south.y = cursor.y + cursor.h;
empty_south.w = scroll.w;
empty_south.h = NK_MAX((scroll.y + scroll.h) - (cursor.y + cursor.h), 0);

/* update scrollbar */
scroll_offset = nk_scrollbar_behavior(state, in, has_scrolling, &scroll, &cursor,
&empty_north, &empty_south, scroll_offset, target, scroll_step, NK_VERTICAL);
scroll_off = scroll_offset / target;
cursor.y = scroll.y + (scroll_off * scroll.h) + style->border_cursor + style->padding.y;

/* draw scrollbar */
if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_scrollbar(out, *state, style, &scroll, &cursor);
if (style->draw_end) style->draw_end(out, style->userdata);
return scroll_offset;
}